

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O0

mu_Rect mu_layout_next(mu_Context *ctx)

{
  mu_Style *pmVar1;
  mu_Rect mVar2;
  int iVar3;
  mu_Layout *pmVar4;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int iStack_40;
  int type;
  mu_Rect res;
  mu_Style *style;
  mu_Layout *layout;
  mu_Context *ctx_local;
  undefined8 local_10;
  
  pmVar4 = get_layout(ctx);
  pmVar1 = ctx->style;
  if (pmVar4->next_type == 0) {
    if (pmVar4->item_index == pmVar4->items) {
      mu_layout_row(ctx,pmVar4->items,(int *)0x0,(pmVar4->size).y);
    }
    _iStack_40 = pmVar4->position;
    if (pmVar4->items < 1) {
      local_48 = (pmVar4->size).x;
    }
    else {
      local_48 = pmVar4->widths[pmVar4->item_index];
    }
    res.y = (pmVar4->size).y;
    if (local_48 == 0) {
      local_48 = (pmVar1->size).x + pmVar1->padding * 2;
    }
    if (res.y == 0) {
      res.y = (pmVar1->size).y + pmVar1->padding * 2;
    }
    if (local_48 < 0) {
      local_48 = ((pmVar4->body).w - (pmVar4->position).x) + 1 + local_48;
    }
    if (res.y < 0) {
      res.y = ((pmVar4->body).h - (pmVar4->position).y) + 1 + res.y;
    }
    res.x = local_48;
    pmVar4->item_index = pmVar4->item_index + 1;
  }
  else {
    iVar3 = pmVar4->next_type;
    pmVar4->next_type = 0;
    iStack_40 = (pmVar4->next).x;
    type = (pmVar4->next).y;
    res.x = (pmVar4->next).w;
    res.y = (pmVar4->next).h;
    if (iVar3 == 2) {
      (ctx->last_rect).x = iStack_40;
      (ctx->last_rect).y = type;
      (ctx->last_rect).w = res.x;
      (ctx->last_rect).h = res.y;
      ctx_local = *(mu_Context **)&ctx->last_rect;
      local_10._0_4_ = (ctx->last_rect).w;
      local_10._4_4_ = (ctx->last_rect).h;
      goto LAB_0017ee32;
    }
  }
  (pmVar4->position).x = res.x + pmVar1->spacing + (pmVar4->position).x;
  if (type + res.y + pmVar1->spacing < pmVar4->next_row) {
    local_4c = pmVar4->next_row;
  }
  else {
    local_4c = type + res.y + pmVar1->spacing;
  }
  pmVar4->next_row = local_4c;
  iStack_40 = (pmVar4->body).x + iStack_40;
  iVar3 = (pmVar4->body).y + type;
  if (iStack_40 + res.x < (pmVar4->max).x) {
    local_50 = (pmVar4->max).x;
  }
  else {
    local_50 = iStack_40 + res.x;
  }
  (pmVar4->max).x = local_50;
  if (iVar3 + res.y < (pmVar4->max).y) {
    local_54 = (pmVar4->max).y;
  }
  else {
    local_54 = iVar3 + res.y;
  }
  (pmVar4->max).y = local_54;
  (ctx->last_rect).x = iStack_40;
  (ctx->last_rect).y = iVar3;
  (ctx->last_rect).w = res.x;
  (ctx->last_rect).h = res.y;
  ctx_local = *(mu_Context **)&ctx->last_rect;
  local_10._0_4_ = (ctx->last_rect).w;
  local_10._4_4_ = (ctx->last_rect).h;
LAB_0017ee32:
  mVar2.w = (undefined4)local_10;
  mVar2.h = local_10._4_4_;
  mVar2._0_8_ = ctx_local;
  return mVar2;
}

Assistant:

mu_Rect mu_layout_next(mu_Context *ctx) {
  mu_Layout *layout = get_layout(ctx);
  mu_Style *style = ctx->style;
  mu_Rect res;

  if (layout->next_type) {
    /* handle rect set by `mu_layout_set_next` */
    int type = layout->next_type;
    layout->next_type = 0;
    res = layout->next;
    if (type == ABSOLUTE) { return (ctx->last_rect = res); }

  } else {
    /* handle next row */
    if (layout->item_index == layout->items) {
      mu_layout_row(ctx, layout->items, NULL, layout->size.y);
    }

    /* position */
    res.x = layout->position.x;
    res.y = layout->position.y;

    /* size */
    res.w = layout->items > 0 ? layout->widths[layout->item_index] : layout->size.x;
    res.h = layout->size.y;
    if (res.w == 0) { res.w = style->size.x + style->padding * 2; }
    if (res.h == 0) { res.h = style->size.y + style->padding * 2; }
    if (res.w <  0) { res.w += layout->body.w - res.x + 1; }
    if (res.h <  0) { res.h += layout->body.h - res.y + 1; }

    layout->item_index++;
  }

  /* update position */
  layout->position.x += res.w + style->spacing;
  layout->next_row = mu_max(layout->next_row, res.y + res.h + style->spacing);

  /* apply body offset */
  res.x += layout->body.x;
  res.y += layout->body.y;

  /* update max position */
  layout->max.x = mu_max(layout->max.x, res.x + res.w);
  layout->max.y = mu_max(layout->max.y, res.y + res.h);

  return (ctx->last_rect = res);
}